

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::peer_list::new_connection
          (peer_list *this,peer_connection_interface *c,int session_time,torrent_state *state)

{
  _Map_pointer *__return_storage_ptr__;
  long *plVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short port;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pptVar7;
  undefined4 extraout_var_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 extraout_var_04;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar10;
  undefined4 extraout_var_05;
  basic_endpoint<boost::asio::ip::tcp> *pbVar11;
  long lVar12;
  size_type sVar13;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ipv6_peer *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  difference_type dVar14;
  address *addr_00;
  address *addr_01;
  match_peer_endpoint __pred;
  bool local_75a;
  bool local_759;
  ushort local_74a;
  ushort local_73c;
  bool local_6f2;
  __type_conflict1 local_6a1;
  bool local_641;
  bool local_619;
  iterator local_5f0;
  const_iterator local_5d0;
  iterator local_5b0;
  peer_source_flags_t local_58a;
  peer_source_flags_t local_589;
  ipv6_peer *local_588;
  torrent_peer *p;
  undefined1 auStack_578 [5];
  bool is_v6;
  char *local_570;
  address local_560;
  iterator local_540;
  iterator local_520;
  torrent_peer *local_500;
  _Elt_pointer local_4f8;
  _Elt_pointer local_4f0;
  _Elt_pointer local_4e8;
  undefined1 local_4d9;
  error_code local_4d8;
  undefined1 local_4c2;
  undefined1 local_4c1;
  error_code local_4c0;
  undefined1 local_4a9;
  error_code local_4a8;
  bool local_495;
  uint local_494;
  undefined1 local_490 [3];
  bool disconnect1_1;
  int other_port;
  basic_endpoint<boost::asio::ip::tcp> local_474;
  uint local_458;
  byte local_452;
  undefined1 local_451;
  int our_port;
  bool outgoing1;
  undefined1 local_439;
  error_code local_438;
  bool local_421;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_420;
  bool disconnect1;
  string *other_dest;
  error_code local_410;
  undefined1 local_3f9;
  error_code local_3f8;
  undefined1 local_3e1;
  error_code local_3e0;
  basic_endpoint<boost::asio::ip::tcp> local_3cc;
  basic_endpoint<boost::asio::ip::tcp> local_3b0;
  __type_conflict1 local_391;
  undefined4 local_390;
  bool self_connection;
  error_code local_388;
  address local_378;
  string local_358;
  address local_338;
  string local_318;
  address local_2f8;
  address local_2d8;
  iterator local_2b8;
  address local_290;
  iterator local_270;
  iterator local_250;
  torrent_peer *local_230;
  _Elt_pointer local_228;
  _Elt_pointer local_220;
  _Elt_pointer local_218;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_210;
  basic_string_view<char,_std::char_traits<char>_> local_200;
  iterator local_1f0;
  iterator local_1c8;
  iterator local_1a8;
  torrent_peer *local_188;
  _Elt_pointer local_180;
  _Elt_pointer local_178;
  _Elt_pointer local_170;
  match_peer_endpoint local_168;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_158;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_138;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_118;
  undefined1 local_f8 [8];
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  address addr;
  endpoint *remote;
  undefined1 local_78 [7];
  bool found;
  string i2p_dest;
  torrent_peer *i;
  iterator iter;
  torrent_state *state_local;
  int session_time_local;
  peer_connection_interface *c_local;
  peer_list *this_local;
  undefined4 extraout_var_08;
  
  iter._M_node = (_Map_pointer)state;
  ::std::
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  ::_Deque_iterator((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                     *)&i);
  i2p_dest.field_2._8_8_ = 0;
  iVar4 = (**c->_vptr_peer_connection_interface)();
  ::std::__cxx11::string::string((string *)local_78,(string *)CONCAT44(extraout_var,iVar4));
  if ((((ulong)*iter._M_node & 0x100) == 0) ||
     (uVar6 = ::std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
    uVar6 = ::std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin(&local_1a8,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::end
                (&local_1c8,
                 (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  *)this);
      ::std::
      lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,std::__cxx11::string,libtorrent::aux::peer_address_compare>
                (&local_188,&local_1a8,&local_1c8,local_78);
      i = local_188;
      iter._M_cur = local_180;
      iter._M_first = local_178;
      iter._M_last = local_170;
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::end
                (&local_1f0,
                 (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  *)this);
      bVar2 = ::std::operator!=((_Self *)&i,&local_1f0);
      local_619 = false;
      if (bVar2) {
        pptVar7 = ::std::
                  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                  ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                               *)&i);
        local_619 = false;
        if ((*(uint *)&(*pptVar7)->field_0x1b >> 0x19 & 1) != 0) {
          pptVar7 = ::std::
                    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                    ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                                 *)&i);
          local_200 = torrent_peer::dest(*pptVar7);
          local_210 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78)
          ;
          local_619 = ::std::operator==(local_200,local_210);
        }
      }
      remote._7_1_ = local_619 != false;
    }
    else {
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin(&local_250,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::end
                (&local_270,
                 (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  *)this);
      iVar4 = (*c->_vptr_peer_connection_interface[2])();
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_290,(basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_01,iVar4))
      ;
      ::std::
      lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,libtorrent::aux::peer_address_compare>
                (&local_230,&local_250,&local_270,&local_290);
      i = local_230;
      iter._M_cur = local_228;
      iter._M_first = local_220;
      iter._M_last = local_218;
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::end
                (&local_2b8,
                 (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                  *)this);
      bVar2 = ::std::operator!=((_Self *)&i,&local_2b8);
      local_641 = false;
      if (bVar2) {
        pptVar7 = ::std::
                  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                  ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                               *)&i);
        torrent_peer::address(&local_2d8,*pptVar7);
        iVar4 = (*c->_vptr_peer_connection_interface[2])();
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  (&local_2f8,
                   (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_02,iVar4));
        local_641 = boost::asio::ip::operator==(&local_2d8,&local_2f8);
      }
      remote._7_1_ = local_641 != false;
    }
  }
  else {
    iVar4 = (*c->_vptr_peer_connection_interface[2])();
    __return_storage_ptr__ = &range.second._M_node;
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              ((address *)__return_storage_ptr__,
               (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_00,iVar4));
    find_peers((pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
                *)local_f8,this,(address *)__return_storage_ptr__);
    ::std::
    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
    ::_Deque_iterator(&local_138,
                      (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                       *)local_f8);
    ::std::
    _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
    ::_Deque_iterator(&local_158,
                      (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                       *)&range.first._M_node);
    port = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                     ((basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_00,iVar4));
    anon_unknown.dwarf_84ea70::match_peer_endpoint::match_peer_endpoint
              (&local_168,(address *)&range.second._M_node,port);
    __pred.m_port = local_168.m_port;
    __pred._10_2_ = local_168._10_2_;
    __pred.m_addr = local_168.m_addr;
    __pred._12_4_ = 0;
    ::std::
    find_if<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
              (&local_118,&local_138,&local_158,__pred);
    i = (torrent_peer *)local_118._M_cur;
    iter._M_cur = local_118._M_first;
    iter._M_first = local_118._M_last;
    iter._M_last = (_Elt_pointer)local_118._M_node;
    remote._7_1_ = ::std::operator!=((_Self *)&i,(_Self *)&range.first._M_node);
  }
  if (remote._7_1_ == false) {
    if (*(int *)((long)iter._M_node + 4) != 0) {
      sVar13 = ::std::
               deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)this);
      if (*(int *)((long)iter._M_node + 4) <= (int)sVar13) {
        local_4c2 = 2;
        erase_peers(this,(torrent_state *)iter._M_node,(erase_peer_flags_t)0x2);
        sVar13 = ::std::
                 deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ::size((deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         *)this);
        if (*(int *)((long)iter._M_node + 4) <= (int)sVar13) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_4d8,too_many_connections,(type *)0x0);
          local_4d9 = 0;
          (*c->_vptr_peer_connection_interface[4])(c,&local_4d8,1,0);
          this_local._7_1_ = false;
          goto LAB_004faf6c;
        }
        ::std::
        deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        begin(&local_520,
              (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
               *)this);
        ::std::
        deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
        end(&local_540,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
        iVar4 = (*c->_vptr_peer_connection_interface[2])();
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  (&local_560,
                   (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_06,iVar4));
        ::std::
        lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,libtorrent::aux::peer_address_compare>
                  (&local_500,&local_520,&local_540,&local_560);
        i = local_500;
        iter._M_cur = local_4f8;
        iter._M_first = local_4f0;
        iter._M_last = local_4e8;
      }
    }
    uVar6 = ::std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      _auStack_578 = (string_view)
                     ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
      p._7_1_ = ' ';
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void>::
      bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::pex_flags_tag,_void> *)((long)&p + 6))
      ;
      i2p_dest.field_2._8_8_ =
           add_i2p_peer(this,_auStack_578,p._7_1_,p._6_1_,(torrent_state *)iter._M_node);
      bVar2 = is_connect_candidate(this,(torrent_peer *)i2p_dest.field_2._8_8_);
      if (bVar2) {
        update_connect_candidates(this,-1);
      }
    }
    else {
      iVar4 = (*c->_vptr_peer_connection_interface[2])();
      p._5_1_ = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                          ((basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_07,iVar4));
      iVar4 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                        (this->m_peer_allocator,(ulong)p._5_1_);
      this_00 = (ipv6_peer *)CONCAT44(extraout_var_08,iVar4);
      local_588 = this_00;
      if (this_00 == (ipv6_peer *)0x0) {
        this_local._7_1_ = false;
        goto LAB_004faf6c;
      }
      if ((p._5_1_ & 1) == 0) {
        iVar4 = (*c->_vptr_peer_connection_interface[2])();
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>::
        bitfield_flag(&local_58a);
        ipv4_peer::ipv4_peer
                  ((ipv4_peer *)this_00,(endpoint *)CONCAT44(extraout_var_10,iVar4),false,local_58a)
        ;
      }
      else {
        iVar4 = (*c->_vptr_peer_connection_interface[2])();
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>::
        bitfield_flag(&local_589);
        ipv6_peer::ipv6_peer(this_00,(endpoint *)CONCAT44(extraout_var_09,iVar4),false,local_589);
      }
      local_588 = this_00;
      ::std::
      _Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*const&,libtorrent::aux::torrent_peer*const*>
      ::
      _Deque_iterator<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,void>
                ((_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*const&,libtorrent::aux::torrent_peer*const*>
                  *)&local_5d0,
                 (_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                  *)&i);
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      insert(&local_5b0,
             (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
              *)this,&local_5d0,(value_type *)&local_588);
      i = (torrent_peer *)local_5b0._M_cur;
      iter._M_cur = local_5b0._M_first;
      iter._M_first = local_5b0._M_last;
      iter._M_last = (_Elt_pointer)local_5b0._M_node;
      iVar4 = this->m_round_robin;
      ::std::
      deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      begin(&local_5f0,
            (deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
             *)this);
      dVar14 = ::std::operator-((_Self *)&i,&local_5f0);
      if (dVar14 <= iVar4) {
        this->m_round_robin = this->m_round_robin + 1;
      }
      pptVar7 = ::std::
                _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                             *)&i);
      i2p_dest.field_2._8_8_ = *pptVar7;
      bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_unsigned_char
                        ((bitfield_flag *)&v1_2::peer_info::incoming);
      *(uint *)(i2p_dest.field_2._8_8_ + 0x1b) =
           *(uint *)(i2p_dest.field_2._8_8_ + 0x1b) & 0xff81ffff | (bVar3 & 0x3f) << 0x11;
    }
  }
  else {
    pptVar7 = ::std::
              _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
              ::operator*((_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
                           *)&i);
    i2p_dest.field_2._8_8_ = *pptVar7;
    if (((torrent_peer *)i2p_dest.field_2._8_8_)->connection != (peer_connection_interface *)0x0) {
      uVar5 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
      if ((uVar5 & 1) != 0) {
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          uVar8 = ::std::__cxx11::string::c_str();
          (*c->_vptr_peer_connection_interface[0x12])
                    (c,4,"DUPLICATE PEER","destination: \"%s\"",uVar8);
        }
        else {
          iVar4 = (*c->_vptr_peer_connection_interface[2])();
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    (&local_338,
                     (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_03,iVar4));
          print_address_abi_cxx11_(&local_318,(aux *)&local_338,addr_00);
          uVar8 = ::std::__cxx11::string::c_str();
          torrent_peer::address(&local_378,(torrent_peer *)i2p_dest.field_2._8_8_);
          print_address_abi_cxx11_(&local_358,(aux *)&local_378,addr_01);
          uVar9 = ::std::__cxx11::string::c_str();
          (*c->_vptr_peer_connection_interface[0x12])
                    (c,4,"DUPLICATE PEER","this: \"%s\" that: \"%s\"",uVar8,uVar9);
          ::std::__cxx11::string::~string((string *)&local_358);
          ::std::__cxx11::string::~string((string *)&local_318);
        }
      }
    }
    if ((*(uint *)(i2p_dest.field_2._8_8_ + 0x1b) >> 0x1b & 1) != 0) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_388,peer_banned,(type *)0x0);
      self_connection = false;
      (*c->_vptr_peer_connection_interface[4])(c,&local_388,1,0);
      this_local._7_1_ = false;
      goto LAB_004faf6c;
    }
    if (*(long *)(i2p_dest.field_2._8_8_ + 8) != 0) {
      local_391 = false;
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 8))();
        local_391 = ::std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_78);
      }
      else {
        pbVar11 = (basic_endpoint<boost::asio::ip::tcp> *)
                  (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x10))();
        (*c->_vptr_peer_connection_interface[3])(&local_3b0);
        bVar2 = boost::asio::ip::operator==(pbVar11,&local_3b0);
        local_6a1 = true;
        if (!bVar2) {
          (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x18))(&local_3cc);
          iVar4 = (*c->_vptr_peer_connection_interface[2])();
          local_6a1 = boost::asio::ip::operator==
                                (&local_3cc,
                                 (basic_endpoint<boost::asio::ip::tcp> *)
                                 CONCAT44(extraout_var_04,iVar4));
        }
        local_391 = local_6a1;
      }
      if (local_391 != false) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_3e0,self_connection,(type *)0x0);
        local_3e1 = 1;
        (*c->_vptr_peer_connection_interface[4])(c,&local_3e0,1,1);
        plVar1 = *(long **)(i2p_dest.field_2._8_8_ + 8);
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_3f8,self_connection,(type *)0x0);
        local_3f9 = 1;
        (**(code **)(*plVar1 + 0x20))(plVar1,&local_3f8,1,1);
        this_local._7_1_ = false;
        goto LAB_004faf6c;
      }
      bVar3 = (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x50))();
      iVar4 = (*c->_vptr_peer_connection_interface[10])();
      if ((bVar3 & 1) == ((byte)iVar4 & 1)) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_410,duplicate_peer_id,(type *)0x0);
        other_dest._7_1_ = 0;
        (*c->_vptr_peer_connection_interface[4])(c,&local_410,1,0);
        this_local._7_1_ = false;
        goto LAB_004faf6c;
      }
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pbStack_420 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (**(code **)**(undefined8 **)(i2p_dest.field_2._8_8_ + 8))();
        uVar5 = (*c->_vptr_peer_connection_interface[10])();
        local_6f2 = false;
        if ((uVar5 & 1) != 0) {
          local_6f2 = ::std::operator>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_78,pbStack_420);
        }
        local_421 = local_6f2;
        uVar5 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
        if ((uVar5 & 1) != 0) {
          uVar8 = ::std::__cxx11::string::c_str();
          uVar9 = ::std::__cxx11::string::c_str();
          pcVar10 = "no";
          if ((local_421 & 1U) != 0) {
            pcVar10 = "yes";
          }
          (*c->_vptr_peer_connection_interface[0x12])
                    (c,4,"DUPLICATE_PEER_RESOLUTION","our: %s other: %s disconnecting: %s",uVar8,
                     uVar9,pcVar10);
          plVar1 = *(long **)(i2p_dest.field_2._8_8_ + 8);
          uVar8 = ::std::__cxx11::string::c_str();
          uVar9 = ::std::__cxx11::string::c_str();
          pcVar10 = "yes";
          if ((local_421 & 1U) != 0) {
            pcVar10 = "no";
          }
          (**(code **)(*plVar1 + 0x90))
                    (plVar1,4,"DUPLICATE_PEER_RESOLUTION","our: %s other: %s disconnecting: %s",
                     uVar8,uVar9,pcVar10);
        }
        if ((local_421 & 1U) != 0) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_438,duplicate_peer_id,(type *)0x0);
          local_439 = 0;
          (*c->_vptr_peer_connection_interface[4])(c,&local_438,1,0);
          this_local._7_1_ = false;
          goto LAB_004faf6c;
        }
        this->m_locked_peer = (torrent_peer *)i2p_dest.field_2._8_8_;
        plVar1 = *(long **)(i2p_dest.field_2._8_8_ + 8);
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&our_port,duplicate_peer_id,(type *)0x0);
        local_451 = 0;
        (**(code **)(*plVar1 + 0x20))(plVar1,(error_code *)&our_port,1,0);
        this->m_locked_peer = (torrent_peer *)0x0;
      }
      else {
        uVar5 = (*c->_vptr_peer_connection_interface[10])();
        local_452 = (byte)uVar5 & 1;
        if ((uVar5 & 1) == 0) {
          (*c->_vptr_peer_connection_interface[3])(local_490);
          local_73c = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                                ((basic_endpoint<boost::asio::ip::tcp> *)local_490);
        }
        else {
          (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x18))(&local_474);
          local_73c = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(&local_474);
        }
        local_458 = (uint)local_73c;
        if ((local_452 & 1) == 0) {
          pbVar11 = (basic_endpoint<boost::asio::ip::tcp> *)
                    (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x10))();
          local_74a = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port(pbVar11);
        }
        else {
          iVar4 = (*c->_vptr_peer_connection_interface[2])();
          local_74a = boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::port
                                ((basic_endpoint<boost::asio::ip::tcp> *)
                                 CONCAT44(extraout_var_05,iVar4));
        }
        local_494 = (uint)local_74a;
        if ((((int)local_494 <= (int)local_458) || (local_759 = true, (local_452 & 1) != 0)) &&
           (((int)local_458 <= (int)local_494 || (local_759 = true, (local_452 & 1) == 0)))) {
          local_75a = false;
          if (local_458 == local_494) {
            lVar12 = random((aux *)0x1);
            local_75a = (int)lVar12 != 0;
          }
          local_759 = local_75a;
        }
        local_495 = local_759;
        bVar3 = (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x70))();
        local_495 = (bool)(~bVar3 & local_495 & 1);
        uVar5 = (*c->_vptr_peer_connection_interface[0x11])(c,4);
        if ((uVar5 & 1) != 0) {
          pcVar10 = "no";
          if ((local_495 & 1U) != 0) {
            pcVar10 = "yes";
          }
          (*c->_vptr_peer_connection_interface[0x12])
                    (c,4,"DUPLICATE_PEER_RESOLUTION","our: %d other: %d disconnecting: %s",
                     (ulong)local_458,(ulong)local_494,pcVar10);
          pcVar10 = "yes";
          if ((local_495 & 1U) != 0) {
            pcVar10 = "no";
          }
          (**(code **)(**(long **)(i2p_dest.field_2._8_8_ + 8) + 0x90))
                    (*(long **)(i2p_dest.field_2._8_8_ + 8),4,"DUPLICATE_PEER_RESOLUTION",
                     "our: %d other: %d disconnecting: %s",local_458,local_494,pcVar10);
        }
        if ((local_495 & 1U) != 0) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_4a8,duplicate_peer_id,(type *)0x0);
          local_4a9 = 0;
          (*c->_vptr_peer_connection_interface[4])(c,&local_4a8,1,0);
          this_local._7_1_ = false;
          goto LAB_004faf6c;
        }
        this->m_locked_peer = (torrent_peer *)i2p_dest.field_2._8_8_;
        plVar1 = *(long **)(i2p_dest.field_2._8_8_ + 8);
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  (&local_4c0,duplicate_peer_id,(type *)0x0);
        local_4c1 = 0;
        (**(code **)(*plVar1 + 0x20))(plVar1,&local_4c0,1,0);
        this->m_locked_peer = (torrent_peer *)0x0;
      }
    }
    bVar2 = is_connect_candidate(this,(torrent_peer *)i2p_dest.field_2._8_8_);
    if (bVar2) {
      update_connect_candidates(this,-1);
    }
  }
  (*c->_vptr_peer_connection_interface[9])(c,i2p_dest.field_2._8_8_);
  (*c->_vptr_peer_connection_interface[0xb])
            (c,(ulong)*(uint *)(i2p_dest.field_2._8_8_ + 4) << 10,
             (ulong)*(uint *)i2p_dest.field_2._8_8_ << 10);
  *(undefined4 *)(i2p_dest.field_2._8_8_ + 4) = 0;
  *(undefined4 *)i2p_dest.field_2._8_8_ = 0;
  *(peer_connection_interface **)(i2p_dest.field_2._8_8_ + 8) = c;
  uVar5 = (*c->_vptr_peer_connection_interface[0xc])();
  if ((uVar5 & 1) == 0) {
    *(short *)(i2p_dest.field_2._8_8_ + 0x16) = (short)session_time;
  }
  this_local._7_1_ = true;
LAB_004faf6c:
  local_390 = 1;
  ::std::__cxx11::string::~string((string *)local_78);
  return this_local._7_1_;
}

Assistant:

bool peer_list::new_connection(peer_connection_interface& c, int session_time
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
//		TORRENT_ASSERT(!c.is_outgoing());

		INVARIANT_CHECK;

		iterator iter;
		torrent_peer* i = nullptr;

#if TORRENT_USE_I2P
		std::string const i2p_dest = c.destination();
#else
		std::string const i2p_dest;
#endif

		bool found = false;
		// this check doesn't support i2p peers
		if (state->allow_multiple_connections_per_ip && i2p_dest.empty())
		{
			auto const& remote = c.remote();
			auto const addr = remote.address();
			auto const range = find_peers(addr);
			iter = std::find_if(range.first, range.second, match_peer_endpoint(addr, remote.port()));

			if (iter != range.second)
			{
				TORRENT_ASSERT((*iter)->in_use);
				found = true;
			}
		}
		else
		{
#if TORRENT_USE_I2P
			if (!i2p_dest.empty())
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, i2p_dest, peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->is_i2p_addr && (*iter)->dest() == i2p_dest)
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
			else
#endif
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, c.remote().address(), peer_address_compare()
					);

				if (iter != m_peers.end() && (*iter)->address() == c.remote().address())
				{
					TORRENT_ASSERT((*iter)->in_use);
					found = true;
				}
			}
		}

		// make sure the iterator we got is properly sorted relative
		// to the connection's address
//		TORRENT_ASSERT(m_peers.empty()
//			|| (iter == m_peers.end() && (*(iter-1))->address() < c.remote().address())
//			|| (iter != m_peers.end() && c.remote().address() < (*iter)->address())
//			|| (iter != m_peers.end() && iter != m_peers.begin() && (*(iter-1))->address() < c.remote().address()));

		if (found)
		{
			i = *iter;
			TORRENT_ASSERT(i->in_use);
			TORRENT_ASSERT(i->connection != &c);
			TORRENT_ASSERT(i->address() == c.remote().address());

#ifndef TORRENT_DISABLE_LOGGING
			if (i->connection != nullptr && c.should_log(peer_log_alert::info))
			{
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "destination: \"%s\""
						, i2p_dest.c_str());
				}
				else
#endif
				{
					c.peer_log(peer_log_alert::info, "DUPLICATE PEER", "this: \"%s\" that: \"%s\""
						, print_address(c.remote().address()).c_str()
						, print_address(i->address()).c_str());
				}
			}
#endif
			if (i->banned)
			{
				c.disconnect(errors::peer_banned, operation_t::bittorrent);
				return false;
			}

			if (i->connection != nullptr)
			{
				bool self_connection = false;
#if TORRENT_USE_I2P
				if (!i2p_dest.empty())
				{
					self_connection = i->connection->local_i2p_endpoint() == i2p_dest;
				}
				else
#endif
				{
					self_connection = i->connection->remote() == c.local_endpoint()
					|| i->connection->local_endpoint() == c.remote();
				}

				if (self_connection)
				{
					c.disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection->peer_info_struct() == i);
					i->connection->disconnect(errors::self_connection, operation_t::bittorrent, peer_connection_interface::failure);
					TORRENT_ASSERT(i->connection == nullptr);
					return false;
				}

				TORRENT_ASSERT(i->connection != &c);
				// the new connection is a local (outgoing) connection
				// or the current one is already connected
				if (i->connection->is_outgoing() == c.is_outgoing())
				{
					// if the other end connected to us both times, just drop
					// the second one. Or if we made both connections.
					c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					return false;
				}
#if TORRENT_USE_I2P
				else if (!i2p_dest.empty())
				{
					// duplicate connection resolution for i2p connections is
					// simple. The smaller address takes priority for making the
					// outgoing connection

					std::string const& other_dest = i->connection->destination();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = c.is_outgoing() && i2p_dest > other_dest;

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, i2p_dest.c_str(), other_dest.c_str(), disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %s other: %s disconnecting: %s"
							, other_dest.c_str(), i2p_dest.c_str(), disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
#endif
				else
				{
					// at this point, we need to disconnect either
					// i->connection or c. In order for both this client
					// and the client on the other end to decide to
					// disconnect the same one, we need a consistent rule to
					// select which one.

					bool const outgoing1 = c.is_outgoing();

					// for this, we compare our ports and whoever has the lower port
					// should be the one keeping its outgoing connection. Since
					// outgoing ports are selected at random by the OS, we need to
					// be careful to only look at the target end of a connection for
					// the endpoint.

					int const our_port = outgoing1 ? i->connection->local_endpoint().port() : c.local_endpoint().port();
					int const other_port = outgoing1 ? c.remote().port() : i->connection->remote().port();

					// decide which peer connection to disconnect
					// if the ports are equal, pick on at random
					bool disconnect1 = ((our_port < other_port) && !outgoing1)
						|| ((our_port > other_port) && outgoing1)
						|| ((our_port == other_port) && random(1));
					disconnect1 &= !i->connection->failed();

#ifndef TORRENT_DISABLE_LOGGING
					if (c.should_log(peer_log_alert::info))
					{
						c.peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "yes" : "no");
						i->connection->peer_log(peer_log_alert::info, "DUPLICATE_PEER_RESOLUTION"
							, "our: %d other: %d disconnecting: %s"
							, our_port, other_port, disconnect1 ? "no" : "yes");
					}
#endif

					if (disconnect1)
					{
						c.disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
						return false;
					}
					TORRENT_ASSERT(m_locked_peer == nullptr);
					m_locked_peer = i;
					i->connection->disconnect(errors::duplicate_peer_id, operation_t::bittorrent);
					m_locked_peer = nullptr;
				}
			}

			if (is_connect_candidate(*i))
				update_connect_candidates(-1);
		}